

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockReturnValueTest.cpp
# Opt level: O0

void __thiscall
TEST_MockReturnValueTest_hasReturnValue_Test::~TEST_MockReturnValueTest_hasReturnValue_Test
          (TEST_MockReturnValueTest_hasReturnValue_Test *this)

{
  TEST_MockReturnValueTest_hasReturnValue_Test *this_local;
  
  ~TEST_MockReturnValueTest_hasReturnValue_Test(this);
  operator_delete(this,8);
  return;
}

Assistant:

TEST(MockReturnValueTest, hasReturnValue)
{
    CHECK(!mock().hasReturnValue());
    mock().expectOneCall("foo");
    CHECK(!mock().actualCall("foo").hasReturnValue());
    CHECK(!mock().hasReturnValue());

    mock().expectOneCall("foo2").andReturnValue(1);
    CHECK(mock().actualCall("foo2").hasReturnValue());
    CHECK(mock().hasReturnValue());
}